

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

int __thiscall testing::internal::String::Compare(String *this,String *rhs)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  
  pcVar3 = rhs->c_str_;
  if (this->c_str_ == (char *)0x0) {
    iVar6 = -(uint)(pcVar3 != (char *)0x0);
  }
  else {
    iVar6 = 1;
    if (pcVar3 != (char *)0x0) {
      uVar4 = this->length_;
      uVar5 = rhs->length_;
      uVar7 = uVar5;
      if (uVar4 < uVar5) {
        uVar7 = uVar4;
      }
      uVar8 = 0;
      while( true ) {
        if (uVar7 == uVar8) {
          if (uVar4 < uVar5) {
            return -1;
          }
          return (uint)(uVar5 < uVar4);
        }
        cVar2 = this->c_str_[uVar8];
        pcVar1 = pcVar3 + uVar8;
        if (cVar2 < *pcVar1) break;
        uVar8 = uVar8 + 1;
        if (*pcVar1 < cVar2) {
          return 1;
        }
      }
      return -1;
    }
  }
  return iVar6;
}

Assistant:

const char* c_str() const { return c_str_; }